

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::emplace_decomposable<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *key,size_t hashval,piecewise_construct_t *args,
          tuple<int_&&> *args_1,tuple<int_&&> *args_2)

{
  int *piVar1;
  long lVar2;
  size_t i;
  ctrl_t *pcVar3;
  int *piVar4;
  bool bVar5;
  
  i = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_find_key<int>((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)this,key,hashval);
  bVar5 = i == 0xffffffffffffffff;
  if (bVar5) {
    i = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::prepare_insert((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)this,hashval);
    lVar2 = *(long *)((long)this + 8);
    piVar4 = (int *)operator_new(8);
    piVar1 = (args_2->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
             _M_head_impl;
    *piVar4 = *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
               _M_head_impl;
    piVar4[1] = *piVar1;
    *(int **)(lVar2 + i * 8) = piVar4;
    raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)this,i,(byte)hashval & 0x7f);
    pcVar3 = (ctrl_t *)(i + *this);
  }
  else {
    pcVar3 = (ctrl_t *)(*this + i);
  }
  lVar2 = *(long *)((long)this + 8);
  (__return_storage_ptr__->first).ctrl_ = pcVar3;
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 8 + lVar2);
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }